

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::visitTable(PrintSExpression *this,Table *curr)

{
  ostream *poVar1;
  size_t sVar2;
  char *__s;
  char cVar3;
  _Ios_Iostate _Var4;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  poVar1 = this->o;
  cVar3 = (char)this->indent;
  local_50 = local_40;
  if ((curr->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    printTableHeader(this,curr);
    poVar1 = this->o;
    __s = this->maybeNewLine;
    if (__s != (char *)0x0) goto LAB_00a3afc9;
    _Var4 = (int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18);
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    local_50._0_1_ = 0x28;
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
    emitImportHeader(this,&curr->super_Importable);
    printTableHeader(this,curr);
    local_50 = (long *)CONCAT71(local_50._1_7_,0x29);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
    __s = this->maybeNewLine;
    if (__s != (char *)0x0) {
LAB_00a3afc9:
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
      return;
    }
    _Var4 = (int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18);
  }
  std::ios::clear(_Var4);
  return;
}

Assistant:

void PrintSExpression::visitTable(Table* curr) {
  if (curr->imported()) {
    doIndent(o, indent);
    o << '(';
    emitImportHeader(curr);
    printTableHeader(curr);
    o << ')' << maybeNewLine;
  } else {
    doIndent(o, indent);
    printTableHeader(curr);
    o << maybeNewLine;
  }
}